

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall ChatServer::connectionCreated(ChatServer *this,Stream *stream)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  string nick;
  Stream *stream_local;
  
  stream_local = stream;
  poVar1 = std::operator<<((ostream *)&std::cout,"+ Incoming connection from ");
  Dashel::Stream::getTargetName_abi_cxx11_(&nick,stream);
  poVar1 = std::operator<<(poVar1,(string *)&nick);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&nick);
  readLine_abi_cxx11_(&nick,stream);
  std::__cxx11::string::erase((ulong)&nick,nick._M_string_length - 1);
  pmVar2 = std::
           map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->nicks,&stream_local);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"+ User ");
  poVar1 = std::operator<<(poVar1,(string *)&nick);
  poVar1 = std::operator<<(poVar1," is connected.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&nick);
  return;
}

Assistant:

void connectionCreated(Stream* stream)
	{
		cout << "+ Incoming connection from " << stream->getTargetName() << " (" << stream << ")" << endl;
		string nick = readLine(stream);
		nick.erase(nick.length() - 1);
		nicks[stream] = nick;
		cout << "+ User " << nick << " is connected." << endl;
	}